

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O3

SolveStrategy *
Clasp::ClaspFacade::SolveStrategy::create(SolveMode_t m,ClaspFacade *f,SolveAlgorithm *algo)

{
  SolveStrategy *pSVar1;
  
  if ((m.val_ & Async) == Default) {
    pSVar1 = (SolveStrategy *)operator_new(0x58);
    pSVar1->_vptr_SolveStrategy = (_func_int **)&PTR__SolveStrategy_001e62a0;
    pSVar1->facade_ = f;
    pSVar1->algo_ = algo;
    (pSVar1->error_)._M_dataplus._M_p = (pointer)&(pSVar1->error_).field_2;
    (pSVar1->error_)._M_string_length = 0;
    (pSVar1->error_).field_2._M_local_buf[0] = '\0';
    pSVar1->handler_ = (EventHandler *)0x0;
    (pSVar1->mode_).val_ = m.val_;
    LOCK();
    (pSVar1->nrefs_).super___atomic_base<unsigned_int>._M_i = 1;
    UNLOCK();
    LOCK();
    (pSVar1->signal_).super___atomic_base<unsigned_int>._M_i = 0;
    UNLOCK();
    LOCK();
    (pSVar1->state_).super___atomic_base<unsigned_int>._M_i = 0;
    UNLOCK();
  }
  else {
    pSVar1 = (SolveStrategy *)operator_new(0xb8);
    pSVar1->_vptr_SolveStrategy = (_func_int **)&PTR__SolveStrategy_001e62a0;
    pSVar1->facade_ = f;
    pSVar1->algo_ = algo;
    (pSVar1->error_)._M_dataplus._M_p = (pointer)&(pSVar1->error_).field_2;
    (pSVar1->error_)._M_string_length = 0;
    (pSVar1->error_).field_2._M_local_buf[0] = '\0';
    pSVar1->handler_ = (EventHandler *)0x0;
    (pSVar1->mode_).val_ = m.val_;
    LOCK();
    (pSVar1->nrefs_).super___atomic_base<unsigned_int>._M_i = 1;
    UNLOCK();
    LOCK();
    (pSVar1->signal_).super___atomic_base<unsigned_int>._M_i = 0;
    UNLOCK();
    LOCK();
    (pSVar1->state_).super___atomic_base<unsigned_int>._M_i = 0;
    UNLOCK();
    pSVar1->_vptr_SolveStrategy = (_func_int **)&PTR__Async_001e6380;
    pSVar1[1]._vptr_SolveStrategy = (_func_int **)0x0;
    pSVar1[1].facade_ = (ClaspFacade *)0x0;
    pSVar1[1].algo_ = (SolveAlgorithm *)0x0;
    pSVar1[1].error_._M_dataplus._M_p = (pointer)0x0;
    pSVar1[1].error_._M_string_length = 0;
    pSVar1[1].error_.field_2._M_allocated_capacity = 0;
    std::condition_variable::condition_variable
              ((condition_variable *)(pSVar1[1].error_.field_2._M_local_buf + 8));
  }
  return pSVar1;
}

Assistant:

ClaspFacade::SolveStrategy* ClaspFacade::SolveStrategy::create(SolveMode_t m, ClaspFacade& f, SolveAlgorithm& algo) {
	if ((m & SolveMode_t::Async) == 0) { return new SolveStrategy(m, f, &algo); }
#if CLASP_HAS_THREADS
	return new SolveStrategy::Async(m, f, &algo);
#else
	POTASSCO_REQUIRE(CLASP_HAS_THREADS, "Solve mode not supported!");
#endif
}